

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

void __thiscall
GlobOpt::GenerateSecondaryInductionVariableBound
          (GlobOpt *this,Loop *loop,StackSym *inductionVariableSym,LoopCount *loopCount,
          int maxMagnitudeChange,bool needsMagnitudeAdjustment,StackSym *boundSym)

{
  BailOutInfo *bailOutInfo;
  Instr *instr;
  Func *func;
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  BailOutInstrTemplate<IR::Instr> *pBVar7;
  RegOpnd *pRVar8;
  IntConstOpnd *this_00;
  
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x73e,"(loop)","loop");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (inductionVariableSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x73f,"(inductionVariableSym)","inductionVariableSym");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if ((inductionVariableSym->m_type | TyInt64) != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x740,
                       "(inductionVariableSym->GetType() == TyInt32 || inductionVariableSym->GetType() == TyUint32)"
                       ,
                       "inductionVariableSym->GetType() == TyInt32 || inductionVariableSym->GetType() == TyUint32"
                      );
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (loopCount == (LoopCount *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x741,"(loopCount)","loopCount");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (loop->loopCount != loopCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x742,"(loopCount == loop->loopCount)","loopCount == loop->loopCount");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  pSVar6 = LoopCount::LoopCountMinusOneSym(loopCount);
  if (pSVar6 == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x743,"(loopCount->LoopCountMinusOneSym())",
                       "loopCount->LoopCountMinusOneSym()");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (maxMagnitudeChange == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x744,"(maxMagnitudeChange != 0)","maxMagnitudeChange != 0");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (maxMagnitudeChange < -0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x745,
                       "(maxMagnitudeChange >= -InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting)"
                       ,
                       "maxMagnitudeChange >= -InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting"
                      );
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (0x10000 < maxMagnitudeChange) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x746,
                       "(maxMagnitudeChange <= InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting)"
                       ,
                       "maxMagnitudeChange <= InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting"
                      );
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (boundSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x747,"(boundSym)","boundSym");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  if (boundSym->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x748,"(boundSym->IsInt32())","boundSym->IsInt32()");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  bailOutInfo = loop->bailOutInfo;
  if (bailOutInfo == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x74e,"(bailOutInfo)","bailOutInfo");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  instr = bailOutInfo->bailOutInstr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x751,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  func = bailOutInfo->bailOutFunc;
  if (needsMagnitudeAdjustment) {
    GenerateLoopCountPlusOne(this,loop,loopCount);
    pSVar6 = LoopCount::LoopCountSym(loopCount);
  }
  else {
    pSVar6 = LoopCount::LoopCountMinusOneSym(loopCount);
  }
  if ((maxMagnitudeChange != -1) && (maxMagnitudeChange != 1)) {
    pBVar7 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Mul_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo,func);
    pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
    if ((pBVar7->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004a7f84;
      *puVar5 = 0;
    }
    pFVar1 = (pBVar7->super_Instr).m_func;
    if ((pRVar8->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) goto LAB_004a7f84;
      *puVar5 = 0;
    }
    bVar4 = (pRVar8->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      pRVar8 = (RegOpnd *)IR::Opnd::Copy(&pRVar8->super_Opnd,pFVar1);
      bVar4 = (pRVar8->super_Opnd).field_0xb;
    }
    (pRVar8->super_Opnd).field_0xb = bVar4 | 2;
    (pBVar7->super_Instr).m_src1 = &pRVar8->super_Opnd;
    IR::Opnd::SetIsJITOptimizedReg(&pRVar8->super_Opnd,true);
    this_00 = IR::IntConstOpnd::New((long)maxMagnitudeChange,TyInt32,func,true);
    if ((pBVar7->super_Instr).m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004a7f84;
      *puVar5 = 0;
    }
    pFVar1 = (pBVar7->super_Instr).m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) goto LAB_004a7f84;
      *puVar5 = 0;
    }
    bVar4 = (this_00->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
      bVar4 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar4 | 2;
    (pBVar7->super_Instr).m_src2 = &this_00->super_Opnd;
    pRVar8 = IR::RegOpnd::New(boundSym,boundSym->m_type,func);
    IR::Instr::SetDst(&pBVar7->super_Instr,&pRVar8->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((pBVar7->super_Instr).m_dst,true);
    IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,instr);
    IR::Instr::InsertBefore(instr,&pBVar7->super_Instr);
    pSVar6 = boundSym;
  }
  pBVar7 = IR::BailOutInstrTemplate<IR::Instr>::New
                     (Add_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo,func);
  pRVar8 = IR::RegOpnd::New(pSVar6,pSVar6->m_type,func);
  if ((pBVar7->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  pFVar1 = (pBVar7->super_Instr).m_func;
  if ((pRVar8->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  bVar4 = (pRVar8->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    pRVar8 = (RegOpnd *)IR::Opnd::Copy(&pRVar8->super_Opnd,pFVar1);
    bVar4 = (pRVar8->super_Opnd).field_0xb;
  }
  (pRVar8->super_Opnd).field_0xb = bVar4 | 2;
  (pBVar7->super_Instr).m_src1 = &pRVar8->super_Opnd;
  IR::Opnd::SetIsJITOptimizedReg(&pRVar8->super_Opnd,true);
  pRVar8 = IR::RegOpnd::New(inductionVariableSym,inductionVariableSym->m_type,func);
  if ((pBVar7->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_004a7f84;
    *puVar5 = 0;
  }
  pFVar1 = (pBVar7->super_Instr).m_func;
  if ((pRVar8->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_004a7f84:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (pRVar8->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    pRVar8 = (RegOpnd *)IR::Opnd::Copy(&pRVar8->super_Opnd,pFVar1);
    bVar4 = (pRVar8->super_Opnd).field_0xb;
  }
  (pRVar8->super_Opnd).field_0xb = bVar4 | 2;
  (pBVar7->super_Instr).m_src2 = &pRVar8->super_Opnd;
  IR::Opnd::SetIsJITOptimizedReg(&pRVar8->super_Opnd,true);
  if (maxMagnitudeChange == -1) {
    (pBVar7->super_Instr).m_opcode = Sub_I4;
    IR::Instr::SwapOpnds(&pBVar7->super_Instr);
  }
  pRVar8 = IR::RegOpnd::New(boundSym,boundSym->m_type,func);
  IR::Instr::SetDst(&pBVar7->super_Instr,&pRVar8->super_Opnd);
  IR::Opnd::SetIsJITOptimizedReg((pBVar7->super_Instr).m_dst,true);
  IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,instr);
  IR::Instr::InsertBefore(instr,&pBVar7->super_Instr);
  return;
}

Assistant:

void GlobOpt::GenerateSecondaryInductionVariableBound(
    Loop *const loop,
    StackSym *const inductionVariableSym,
    LoopCount *const loopCount,
    const int maxMagnitudeChange,
    const bool needsMagnitudeAdjustment,
    StackSym *const boundSym)
{
    Assert(loop);
    Assert(inductionVariableSym);
    Assert(inductionVariableSym->GetType() == TyInt32 || inductionVariableSym->GetType() == TyUint32);
    Assert(loopCount);
    Assert(loopCount == loop->loopCount);
    Assert(loopCount->LoopCountMinusOneSym());
    Assert(maxMagnitudeChange != 0);
    Assert(maxMagnitudeChange >= -InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting);
    Assert(maxMagnitudeChange <= InductionVariable::ChangeMagnitudeLimitForLoopCountBasedHoisting);
    Assert(boundSym);
    Assert(boundSym->IsInt32());

    // bound = inductionVariable + loopCountMinusOne * maxMagnitudeChange

    // Prepare the landing pad for bailouts and instruction insertion
    BailOutInfo *const bailOutInfo = loop->bailOutInfo;
    Assert(bailOutInfo);
    const IR::BailOutKind bailOutKind = IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck;
    IR::Instr *const insertBeforeInstr = bailOutInfo->bailOutInstr;
    Assert(insertBeforeInstr);
    Func *const func = bailOutInfo->bailOutFunc;

    StackSym* loopCountSym = nullptr;

    // If indexOffset < maxMagnitudeChange, we need to account for the difference between them in the bound check
    // i.e. BoundCheck: inductionVariable + loopCountMinusOne * maxMagnitudeChange + maxMagnitudeChange - indexOffset <= length - offset
    // Since the BoundCheck instruction already deals with offset, we can simplify this to
    // BoundCheck: inductionVariable + loopCount * maxMagnitudeChange <= length + indexOffset - offset
    if (needsMagnitudeAdjustment)
    {
        GenerateLoopCountPlusOne(loop, loopCount);
        loopCountSym = loopCount->LoopCountSym();
    }
    else
    {
        loopCountSym = loopCount->LoopCountMinusOneSym();
    }
    // intermediateValue = loopCount * maxMagnitudeChange
    StackSym *intermediateValueSym;
    if(maxMagnitudeChange == 1 || maxMagnitudeChange == -1)
    {
        intermediateValueSym = loopCountSym;
    }
    else
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Mul_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc1(
            IR::RegOpnd::New(loopCountSym, loopCountSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        instr->SetSrc2(IR::IntConstOpnd::New(maxMagnitudeChange, TyInt32, func, true));

        intermediateValueSym = boundSym;
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }

    // bound = intermediateValue + inductionVariable
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Add_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        instr->SetSrc2(IR::RegOpnd::New(inductionVariableSym, inductionVariableSym->GetType(), func));
        instr->GetSrc2()->SetIsJITOptimizedReg(true);

        if(maxMagnitudeChange == -1)
        {
            // bound = inductionVariable - intermediateValue[loopCount]
            instr->m_opcode = Js::OpCode::Sub_I4;
            instr->SwapOpnds();
        }

        instr->SetDst(IR::RegOpnd::New(boundSym, boundSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
}